

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketConnection.cpp
# Opt level: O3

void __thiscall FIX::SocketConnection::readMessages(SocketConnection *this,SocketMonitor *s)

{
  Session *this_00;
  bool bVar1;
  string msg;
  string local_80;
  UtcTimeStamp local_60;
  int local_40;
  undefined4 uStack_3c;
  int64_t iStack_38;
  
  if (this->m_pSession != (Session *)0x0) {
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    local_80._M_string_length = 0;
    local_80.field_2._M_local_buf[0] = '\0';
    while( true ) {
      bVar1 = readMessage(this,&local_80);
      if (!bVar1) break;
      this_00 = this->m_pSession;
      DateTime::nowUtc();
      local_60.super_DateTime.m_date = local_40;
      local_60.super_DateTime._12_4_ = uStack_3c;
      local_60.super_DateTime.m_time = iStack_38;
      local_60.super_DateTime._vptr_DateTime = (_func_int **)&PTR__DateTime_001ea8f0;
      Session::next(this_00,&local_80,&local_60,false);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,
                      CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                               local_80.field_2._M_local_buf[0]) + 1);
    }
  }
  return;
}

Assistant:

void SocketConnection::readMessages( SocketMonitor& s )
{
  if( !m_pSession ) return;

  std::string msg;
  while( readMessage( msg ) )
  {
    try
    {
      m_pSession->next( msg, UtcTimeStamp() );
    }
    catch ( InvalidMessage& )
    {
      if( !m_pSession->isLoggedOn() )
        s.drop( m_socket );
    }
  }
}